

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broker.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Coach c;
  Player p;
  Game g;
  Coach local_81;
  Player local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  signal<void_(IEvent_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(IEvent_*)>,_boost::function<void_(const_boost::signals2::connection_&,_IEvent_*)>,_boost::signals2::mutex>
  local_30;
  
  boost::signals2::
  signal<void_(IEvent_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(IEvent_*)>,_boost::function<void_(const_boost::signals2::connection_&,_IEvent_*)>,_boost::signals2::mutex>
  ::signal(&local_30,(int)&local_80,(__sighandler_t)&local_81);
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Marcus","");
  paVar1 = &local_80.name.field_2;
  if (local_50 == &local_40) {
    local_80.name.field_2._8_8_ = local_40._8_8_;
    local_80.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.name._M_dataplus._M_p = (pointer)local_50;
  }
  local_80.name.field_2._M_allocated_capacity._1_7_ = local_40._M_allocated_capacity._1_7_;
  local_80.name.field_2._M_local_buf[0] = local_40._M_local_buf[0];
  local_80.name._M_string_length = local_48;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_80.goals_scored = 0;
  local_80.game = (Game *)&local_30;
  local_50 = &local_40;
  Coach::Coach(&local_81,(Game *)&local_30);
  Player::score(&local_80);
  Player::score(&local_80);
  Player::score(&local_80);
  Player::score(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.name._M_dataplus._M_p,local_80.name.field_2._M_allocated_capacity + 1);
  }
  local_30.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_001107a0;
  boost::detail::shared_count::~shared_count(&local_30._pimpl.pn);
  return 0;
}

Assistant:

int main()
{
	Game g;
	Player p{"Marcus", g};
	Coach c{g};
	p.score();
	p.score();
	p.score();
	p.score();

	return 0;
}